

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

string * __thiscall
smf::Options::getString(string *__return_storage_ptr__,Options *this,string *optionName)

{
  reference ppOVar1;
  string *psVar2;
  allocator local_25;
  int local_24;
  string *psStack_20;
  int index;
  string *optionName_local;
  Options *this_local;
  
  psStack_20 = optionName;
  optionName_local = (string *)this;
  this_local = (Options *)__return_storage_ptr__;
  local_24 = getRegIndex(this,optionName);
  if (local_24 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN OPTION",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else {
    ppOVar1 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(long)local_24);
    psVar2 = Option_register::getOption_abi_cxx11_(*ppOVar1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Options::getString(const std::string& optionName) {
	int index = getRegIndex(optionName);
	if (index < 0) {
		return "UNKNOWN OPTION";
	} else {
		return m_optionRegister[index]->getOption();
	}
}